

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O2

void __thiscall Memory::Recycler::RootAddRef(Recycler *this,void *obj,uint *count)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  uint uVar4;
  undefined4 *puVar5;
  EntryType *pEVar6;
  PinRecord *pPVar7;
  StackBackTrace *pSVar8;
  
  BVar3 = IsValidObject(this,obj,0);
  if (BVar3 == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x23e,"(this->IsValidObject(obj))","this->IsValidObject(obj)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  if (this->transientPinnedObject != (void *)0x0) {
    pEVar6 = SimpleHashTable<void_*,_Memory::Recycler::PinRecord,_Memory::HeapAllocator,_DefaultComparer,_true,_PrimePolicy>
             ::FindOrAddEntry(&this->pinnedObjectMap,this->transientPinnedObject);
    uVar4 = (pEVar6->value).refCount;
    (pEVar6->value).refCount = uVar4 + 1;
    if (uVar4 == 0) {
      this->scanPinnedObjectMap = true;
    }
    if (this->recyclerFlagsTable->LeakStackTrace == true) {
      StackBackTraceNode::Prepend<Memory::NoCheckHeapAllocator>
                ((NoCheckHeapAllocator *)&NoCheckHeapAllocator::Instance,
                 &(pEVar6->value).stackBackTraces,this->transientPinnedObjectStackBackTrace);
    }
  }
  if (count != (uint *)0x0) {
    pPVar7 = SimpleHashTable<void_*,_Memory::Recycler::PinRecord,_Memory::HeapAllocator,_DefaultComparer,_true,_PrimePolicy>
             ::TryGetReference(&this->pinnedObjectMap,obj);
    if (pPVar7 == (PinRecord *)0x0) {
      uVar4 = 1;
    }
    else {
      uVar4 = pPVar7->refCount + 1;
    }
    *count = uVar4;
  }
  this->transientPinnedObject = obj;
  if (this->recyclerFlagsTable->LeakStackTrace == true) {
    pSVar8 = StackBackTrace::Capture<Memory::NoCheckHeapAllocator>
                       ((NoCheckHeapAllocator *)&NoCheckHeapAllocator::Instance,0,0x1e);
    this->transientPinnedObjectStackBackTrace = pSVar8;
  }
  return;
}

Assistant:

void
Recycler::RootAddRef(void* obj, uint *count)
{
    Assert(this->IsValidObject(obj));

    if (transientPinnedObject)
    {
        PinRecord& refCount = pinnedObjectMap.GetReference(transientPinnedObject);
        ++refCount;
        if (refCount == 1)
        {
            this->scanPinnedObjectMap = true;
            RECYCLER_PERF_COUNTER_INC(PinnedObject);
        }
#if defined(CHECK_MEMORY_LEAK) || defined(LEAK_REPORT)
#ifdef STACK_BACK_TRACE
        if (GetRecyclerFlagsTable().LeakStackTrace)
        {
            StackBackTraceNode::Prepend(&NoCheckHeapAllocator::Instance, refCount.stackBackTraces,
                transientPinnedObjectStackBackTrace);
        }
#endif
#endif
    }

    if (count != nullptr)
    {
        PinRecord* refCount = pinnedObjectMap.TryGetReference(obj);
        *count = (refCount != nullptr) ? (*refCount + 1) : 1;
    }

    transientPinnedObject = obj;

#if defined(CHECK_MEMORY_LEAK) || defined(LEAK_REPORT)
#ifdef STACK_BACK_TRACE
    if (GetRecyclerFlagsTable().LeakStackTrace)
    {
        transientPinnedObjectStackBackTrace = StackBackTrace::Capture(&NoCheckHeapAllocator::Instance);
    }
#endif
#endif
}